

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
duckdb::OutOfRangeException::OutOfRangeException<std::__cxx11::string>
          (OutOfRangeException *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params)

{
  string *in_RDX;
  OutOfRangeException *in_RDI;
  string local_58 [32];
  string local_38 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  string *msg_00;
  
  msg_00 = in_RDX;
  ::std::__cxx11::string::string(local_58,(string *)in_RDX);
  Exception::ConstructMessage<std::__cxx11::string>(msg_00,in_stack_ffffffffffffffe0);
  OutOfRangeException(in_RDI,in_RDX);
  ::std::__cxx11::string::~string(local_38);
  ::std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

explicit OutOfRangeException(const string &msg, ARGS... params)
	    : OutOfRangeException(ConstructMessage(msg, params...)) {
	}